

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::handleElementPSVI
          (AbstractDOMParser *this,XMLCh *localName,XMLCh *uri,PSVIElement *elementInfo)

{
  DOMDocumentImpl *pDVar1;
  byte bVar2;
  bool bVar3;
  VALIDITY_STATE VVar4;
  ASSESSMENT_TYPE AVar5;
  int iVar6;
  TYPE_CATEGORY TVar7;
  DOMDocument *doc;
  DOMTypeInfoImpl *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  XSElementDeclaration *pXVar9;
  DOMTypeInfoImpl *typeInfo;
  PSVIElement *elementInfo_local;
  XMLCh *uri_local;
  XMLCh *localName_local;
  AbstractDOMParser *this_local;
  
  if ((this->fCreateSchemaInfo & 1U) != 0) {
    doc = getDocument(this);
    this_00 = (DOMTypeInfoImpl *)operator_new(0x48,doc);
    DOMTypeInfoImpl::DOMTypeInfoImpl(this_00,(XMLCh *)0x0,(XMLCh *)0x0);
    VVar4 = PSVIItem::getValidity(&elementInfo->super_PSVIItem);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0,(ulong)VVar4);
    AVar5 = PSVIItem::getValidationAttempted(&elementInfo->super_PSVIItem);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,1,(ulong)AVar5);
    iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])();
    if (CONCAT44(extraout_var,iVar6) == 0) {
      VVar4 = PSVIItem::getValidity(&elementInfo->super_PSVIItem);
      if (VVar4 == VALIDITY_VALID) {
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0xf);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,0);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                  (this_00,4,SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                  (this_00,3,SchemaSymbols::fgATTVAL_ANYTYPE);
      }
    }
    else {
      iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])();
      TVar7 = XSTypeDefinition::getTypeCategory((XSTypeDefinition *)CONCAT44(extraout_var_00,iVar6))
      ;
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,(ulong)TVar7);
      iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])();
      bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x38))();
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,(ulong)(bVar2 & 1));
      pDVar1 = this->fDocument;
      iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])();
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x18))();
      pXVar8 = DOMDocumentImpl::getPooledString(pDVar1,pXVar8);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,4,pXVar8);
      pDVar1 = this->fDocument;
      iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])();
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x10))();
      pXVar8 = DOMDocumentImpl::getPooledString(pDVar1,pXVar8);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,3,pXVar8);
    }
    iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])();
    if (CONCAT44(extraout_var_04,iVar6) != 0) {
      iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])();
      bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x38))();
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,9,(ulong)(bVar2 & 1));
      pDVar1 = this->fDocument;
      iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])();
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x18))();
      pXVar8 = DOMDocumentImpl::getPooledString(pDVar1,pXVar8);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,8,pXVar8);
      pDVar1 = this->fDocument;
      iVar6 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])();
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x10))();
      pXVar8 = DOMDocumentImpl::getPooledString(pDVar1,pXVar8);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,7,pXVar8);
    }
    pXVar9 = PSVIElement::getElementDeclaration(elementInfo);
    if (pXVar9 != (XSElementDeclaration *)0x0) {
      pXVar9 = PSVIElement::getElementDeclaration(elementInfo);
      bVar3 = XSElementDeclaration::getNillable(pXVar9);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,6,(ulong)bVar3);
    }
    pDVar1 = this->fDocument;
    pXVar8 = PSVIItem::getSchemaDefault(&elementInfo->super_PSVIItem);
    pXVar8 = DOMDocumentImpl::getPooledString(pDVar1,pXVar8);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,10,pXVar8);
    pDVar1 = this->fDocument;
    pXVar8 = PSVIItem::getSchemaNormalizedValue(&elementInfo->super_PSVIItem);
    pXVar8 = DOMDocumentImpl::getPooledString(pDVar1,pXVar8);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,0xb,pXVar8);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0xc,1);
    (*this->fCurrentParent->_vptr_DOMNode[0x4d])(this->fCurrentParent,this_00);
  }
  if (this->fPSVIHandler != (PSVIHandler *)0x0) {
    (*this->fPSVIHandler->_vptr_PSVIHandler[2])(this->fPSVIHandler,localName,uri,elementInfo);
  }
  return;
}

Assistant:

void AbstractDOMParser::handleElementPSVI(const XMLCh* const            localName
                                        , const XMLCh* const            uri
                                        ,       PSVIElement *           elementInfo)
{
    // associate the info now; if the user wants, she can override what we did
    if(fCreateSchemaInfo)
    {
        DOMTypeInfoImpl* typeInfo=new (getDocument()) DOMTypeInfoImpl();
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validity, elementInfo->getValidity());
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validation_Attempted, elementInfo->getValidationAttempted());
        if(elementInfo->getTypeDefinition())
        {
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, elementInfo->getTypeDefinition()->getTypeCategory());
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, elementInfo->getTypeDefinition()->getAnonymous());
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace,
                fDocument->getPooledString(elementInfo->getTypeDefinition()->getNamespace()));
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name,
                fDocument->getPooledString(elementInfo->getTypeDefinition()->getName()));
        }
        else if(elementInfo->getValidity()==PSVIItem::VALIDITY_VALID)
        {
            // if we are valid but we don't have a type validator, we are xs:anyType
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::COMPLEX_TYPE);
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, false);
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name, SchemaSymbols::fgATTVAL_ANYTYPE);
        }
        if(elementInfo->getMemberTypeDefinition())
        {
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Anonymous, elementInfo->getMemberTypeDefinition()->getAnonymous());
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Namespace,
                fDocument->getPooledString(elementInfo->getMemberTypeDefinition()->getNamespace()));
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Name,
                fDocument->getPooledString(elementInfo->getMemberTypeDefinition()->getName()));
        }
        if(elementInfo->getElementDeclaration())
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Nil, elementInfo->getElementDeclaration()->getNillable());
        typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Default, fDocument->getPooledString(elementInfo->getSchemaDefault()));
        typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Normalized_Value, fDocument->getPooledString(elementInfo->getSchemaNormalizedValue()));
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Schema_Specified, true);
        ((DOMElementNSImpl*)fCurrentParent)->setSchemaTypeInfo(typeInfo);
    }
    if(fPSVIHandler)
        fPSVIHandler->handleElementPSVI(localName, uri, elementInfo);
}